

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O3

void cvui::internal::sparkline
               (cvui_block_t *theBlock,vector<double,_std::allocator<double>_> *theValues,int theX,
               int theY,int theWidth,int theHeight,uint theColor)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  double theMin;
  double theMax;
  double dVar7;
  double dVar8;
  Rect local_68;
  String local_58;
  Size local_38;
  
  pdVar1 = *(double **)theValues;
  pdVar2 = *(double **)(theValues + 8);
  uVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
  local_68.x = theX;
  local_68.y = theY;
  local_68.width = theWidth;
  local_68.height = theHeight;
  if (uVar3 < 2) {
    pcVar5 = "Insufficient data points.";
    if (pdVar2 == pdVar1) {
      pcVar5 = "No data.";
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar4 = pcVar5 + 0x19;
    if (pdVar2 == pdVar1) {
      pcVar4 = pcVar5 + 8;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar5,pcVar4);
    text(theBlock,theX,theY,&local_58,0.4,0xcecece,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    theMin = *pdVar1;
    theMax = theMin;
    if (pdVar2 != pdVar1) {
      uVar6 = 0;
      dVar7 = theMin;
      dVar8 = theMin;
      do {
        theMax = pdVar1[uVar6];
        theMin = theMax;
        if (dVar8 <= theMax) {
          theMin = dVar8;
        }
        if (theMax <= dVar7) {
          theMax = dVar7;
        }
        uVar6 = uVar6 + 1;
        dVar7 = theMax;
        dVar8 = theMin;
      } while (uVar3 != uVar6);
    }
    render::sparkline(theBlock,theValues,&local_68,theMin,theMax,theColor);
  }
  local_38.width = theWidth;
  local_38.height = theHeight;
  updateLayoutFlow(theBlock,&local_38);
  return;
}

Assistant:

void sparkline(cvui_block_t& theBlock, std::vector<double>& theValues, int theX, int theY, int theWidth, int theHeight, unsigned int theColor) {
		double aMin, aMax;
		cv::Rect aRect(theX, theY, theWidth, theHeight);
		std::vector<double>::size_type aHowManyValues = theValues.size();

		if (aHowManyValues >= 2) {
			internal::findMinMax(theValues, &aMin, &aMax);
			render::sparkline(theBlock, theValues, aRect, aMin, aMax, theColor);
		} else {
			internal::text(theBlock, theX, theY, aHowManyValues == 0 ? "No data." : "Insufficient data points.", 0.4, 0xCECECE, false);
		}

		// Update the layout flow
		cv::Size aSize(theWidth, theHeight);
		updateLayoutFlow(theBlock, aSize);
	}